

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::EndRenderScope(DeviceContextVkImpl *this)

{
  bool bVar1;
  pointer this_00;
  StateCache *pSVar2;
  Char *Message;
  VkCommandBuffer pVVar3;
  undefined1 local_30 [8];
  string msg;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_DynamicRenderingInfo);
  if (bVar1) {
    this_00 = std::
              unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
              ::operator->(&this->m_DynamicRenderingInfo);
    bVar1 = VulkanUtilities::RenderingInfoWrapper::HasClears(this_00);
    if (bVar1) {
      pSVar2 = VulkanUtilities::VulkanCommandBuffer::GetState(&this->m_CommandBuffer);
      if (pSVar2->DynamicRenderingHash != 0) {
        FormatString<char[83]>
                  ((string *)local_30,
                   (char (*) [83])
                   "Command buffer must not be in a dynamic render scope when there are pending clears"
                  );
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"EndRenderScope",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x7b3);
        std::__cxx11::string::~string((string *)local_30);
      }
      EnsureVkCmdBuffer(this);
      CommitRenderPassAndFramebuffer(this,false);
    }
  }
  pVVar3 = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer(&this->m_CommandBuffer);
  if (pVVar3 != (VkCommandBuffer)0x0) {
    VulkanUtilities::VulkanCommandBuffer::EndRenderScope(&this->m_CommandBuffer);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::EndRenderScope()
{
    if (m_DynamicRenderingInfo && m_DynamicRenderingInfo->HasClears())
    {
        VERIFY(m_CommandBuffer.GetState().DynamicRenderingHash == 0, "Command buffer must not be in a dynamic render scope when there are pending clears");
        EnsureVkCmdBuffer();
        // Apply clears
        CommitRenderPassAndFramebuffer(/*VerifyStates = */ false);
    }

    if (m_CommandBuffer.GetVkCmdBuffer() != VK_NULL_HANDLE)
    {
        m_CommandBuffer.EndRenderScope();
    }
}